

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_counters.cpp
# Opt level: O0

void __thiscall
libtorrent::counters::blend_stats_counter(counters *this,int c,int64_t value,int ratio)

{
  value_type *pvVar1;
  long lVar2;
  long local_a0;
  int64_t new_value;
  int64_t current;
  int64_t iStack_88;
  int ratio_local;
  int64_t value_local;
  counters *pcStack_78;
  int c_local;
  counters *this_local;
  memory_order local_68;
  int local_64;
  memory_order __b;
  undefined4 local_54;
  long local_50;
  int64_t *local_48;
  value_type *local_40;
  bool local_31;
  long local_30;
  memory_order local_28;
  undefined4 local_24;
  long local_20;
  int64_t *local_18;
  value_type *local_10;
  
  current._4_4_ = ratio;
  iStack_88 = value;
  value_local._4_4_ = c;
  pcStack_78 = this;
  pvVar1 = libtorrent::aux::
           container_wrapper<std::atomic<long>,_long,_std::array<std::atomic<long>,_291UL>_>::
           operator[](&this->m_stats_counter,(long)c);
  local_64 = 0;
  ___b = pvVar1;
  local_68 = ::std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_64 - 1U < 2) {
    this_local = (counters *)(pvVar1->super___atomic_base<long>)._M_i;
  }
  else if (local_64 == 5) {
    this_local = (counters *)(pvVar1->super___atomic_base<long>)._M_i;
  }
  else {
    this_local = (counters *)(pvVar1->super___atomic_base<long>)._M_i;
  }
  new_value = (int64_t)this_local;
  local_a0 = (long)this_local * (long)(100 - current._4_4_) + iStack_88 * current._4_4_;
  while( true ) {
    local_a0 = local_a0 / 100;
    pvVar1 = libtorrent::aux::
             container_wrapper<std::atomic<long>,_long,_std::array<std::atomic<long>,_291UL>_>::
             operator[](&this->m_stats_counter,(long)value_local._4_4_);
    local_50 = local_a0;
    local_54 = 0;
    local_48 = &new_value;
    local_40 = pvVar1;
    local_28 = ::std::__cmpexch_failure_order(memory_order_relaxed);
    local_20 = local_a0;
    local_24 = 0;
    local_30 = local_a0;
    if (local_28 - memory_order_consume < 2) {
      LOCK();
      lVar2 = (pvVar1->super___atomic_base<long>)._M_i;
      local_31 = new_value == lVar2;
      if (local_31) {
        (pvVar1->super___atomic_base<long>)._M_i = local_a0;
        lVar2 = new_value;
      }
      UNLOCK();
      if (!local_31) {
        new_value = lVar2;
      }
    }
    else if (local_28 == memory_order_seq_cst) {
      LOCK();
      lVar2 = (pvVar1->super___atomic_base<long>)._M_i;
      local_31 = new_value == lVar2;
      if (local_31) {
        (pvVar1->super___atomic_base<long>)._M_i = local_a0;
        lVar2 = new_value;
      }
      UNLOCK();
      if (!local_31) {
        new_value = lVar2;
      }
    }
    else {
      LOCK();
      lVar2 = (pvVar1->super___atomic_base<long>)._M_i;
      local_31 = new_value == lVar2;
      if (local_31) {
        (pvVar1->super___atomic_base<long>)._M_i = local_a0;
        lVar2 = new_value;
      }
      UNLOCK();
      if (!local_31) {
        new_value = lVar2;
      }
    }
    if (((local_31 ^ 0xffU) & 1) == 0) break;
    local_a0 = new_value * (100 - current._4_4_) + iStack_88 * current._4_4_;
    local_18 = &new_value;
    local_10 = pvVar1;
  }
  return;
}

Assistant:

void counters::blend_stats_counter(int const c, std::int64_t const value, int const ratio) TORRENT_COUNTER_NOEXCEPT
	{
		TORRENT_ASSERT(c >= num_stats_counters);
		TORRENT_ASSERT(c < num_counters);
		TORRENT_ASSERT(ratio >= 0);
		TORRENT_ASSERT(ratio <= 100);

#ifdef ATOMIC_LLONG_LOCK_FREE
		std::int64_t current = m_stats_counter[c].load(std::memory_order_relaxed);
		std::int64_t new_value = (current * (100 - ratio) + value * ratio) / 100;

		while (!m_stats_counter[c].compare_exchange_weak(current, new_value
			, std::memory_order_relaxed))
		{
			new_value = (current * (100 - ratio) + value * ratio) / 100;
		}
#else
		std::lock_guard<std::mutex> l(m_mutex);
		std::int64_t current = m_stats_counter[c];
		m_stats_counter[c] = (current * (100 - ratio) + value * ratio) / 100;
#endif
	}